

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

void VP8LColorSpaceTransform
               (int width,int height,int bits,int quality,uint32_t *argb,uint32_t *image)

{
  int *piVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int tile_height;
  undefined4 in_register_00000034;
  uint uVar10;
  uint uVar11;
  VP8LMultipliers prev_x;
  VP8LMultipliers prev_y;
  int iVar12;
  uint32_t *puVar13;
  int tile_width;
  int iVar14;
  bool bVar15;
  float fVar16;
  float fVar17;
  VP8LMultipliers local_93c;
  ulong local_938;
  ulong local_930;
  uint local_928;
  int local_924;
  uint local_920;
  uint local_91c;
  uint local_918;
  int local_914;
  ulong local_910;
  uint32_t *local_908;
  ulong local_900;
  undefined8 local_8f8;
  ulong local_8f0;
  ulong local_8e8;
  uint32_t *local_8e0;
  int local_8d4;
  uint local_8d0;
  int local_8cc;
  long local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  uint32_t *local_8b0;
  ulong local_8a8;
  undefined8 local_8a0;
  ulong local_898;
  uint32_t *local_890;
  ulong local_888;
  long local_880;
  ulong local_878;
  ulong local_870;
  uint32_t *local_868;
  long local_860;
  long local_858;
  ulong local_850;
  ulong local_848;
  long local_840;
  int accumulated_blue_histo [256];
  int accumulated_red_histo [256];
  
  local_8a0 = CONCAT44(in_register_00000034,height);
  local_8f8 = CONCAT44(in_register_0000000c,quality);
  bVar3 = (byte)bits;
  uVar7 = 1 << (bVar3 & 0x1f);
  local_900 = (ulong)uVar7;
  uVar8 = (ulong)(uint)width;
  local_928 = (uVar7 + width) - 1 >> (bVar3 & 0x1f);
  uVar7 = (uVar7 + height) - 1;
  bVar3 = bVar3 & 0x1f;
  local_924 = bits;
  local_908 = argb;
  local_8b0 = image;
  memset(accumulated_red_histo,0,0x400);
  memset(accumulated_blue_histo,0,0x400);
  if (0 < (int)(uVar7 >> bVar3)) {
    uVar4 = (int)local_8f8 * 7 >> 8;
    local_878 = (ulong)uVar4;
    local_8cc = uVar4 + 3;
    local_848 = (ulong)(0x32 < (int)local_8f8) * 3 + 4;
    local_880 = (long)(width + 2);
    local_8c8 = (long)(int)local_928;
    local_898 = (ulong)(uVar7 >> bVar3);
    local_888 = (ulong)local_928;
    local_840 = (long)width * 4;
    local_890 = local_908 + -(long)width;
    local_910 = 0;
    local_918 = 0;
    local_91c = 0;
    local_920 = 0;
    uVar6 = 0;
    uVar4 = 0 >> bVar3;
    uVar7 = 0;
    local_930 = uVar8;
    do {
      if (0 < (int)local_928) {
        uVar10 = (int)local_910 << ((byte)local_924 & 0x1f);
        local_8b8 = (ulong)uVar10;
        local_8d0 = uVar10 + (int)local_900;
        uVar11 = (uint)local_8a0;
        if ((int)uVar11 <= (int)local_8d0) {
          local_8d0 = uVar11;
        }
        local_860 = local_910 * local_8c8;
        tile_height = local_8d0 - uVar10;
        uVar5 = uVar10 * (int)uVar8;
        local_8c0 = (ulong)uVar5;
        local_868 = local_908 + (int)uVar5;
        local_870 = (ulong)(uVar11 - uVar10);
        if ((int)local_900 < (int)(uVar11 - uVar10)) {
          local_870 = local_900 & 0xffffffff;
        }
        local_8d4 = (int)local_870 + 1;
        local_850 = 0;
        do {
          uVar11 = (int)local_850 << ((byte)local_924 & 0x1f);
          local_938 = (ulong)uVar11;
          local_914 = (int)local_900 + uVar11;
          iVar14 = (int)uVar8;
          if (iVar14 <= local_914) {
            local_914 = iVar14;
          }
          local_858 = local_850 + local_860;
          if (local_910 != 0) {
            local_918 = local_8b0[local_858 - local_8c8];
            local_91c = local_918 >> 8;
            local_920 = local_918 >> 0x10;
          }
          prev_x = (VP8LMultipliers)
                   ((uint3)uVar6 & 0xff |
                   (uint3)((uVar4 & 0xff) << 8) | (uint3)((uVar7 & 0xff) << 0x10));
          prev_y = (VP8LMultipliers)
                   ((uint3)local_918 & 0xff |
                   (uint3)((local_91c & 0xff) << 8) | (uint3)((local_920 & 0xff) << 0x10));
          tile_width = local_914 - uVar11;
          local_8e0 = local_868 + (int)uVar11;
          fVar16 = GetPredictionCostCrossColorRed
                             (local_8e0,iVar14,tile_width,tile_height,prev_x,prev_y,0,
                              accumulated_red_histo);
          uVar4 = 0;
          uVar8 = 0;
          if (-4 < (int)local_878) {
            uVar8 = 0;
            uVar6 = 0;
            do {
              puVar13 = local_8e0;
              uVar7 = 0x20 >> ((byte)uVar6 & 0x1f);
              local_8e8 = (ulong)uVar7;
              iVar14 = -uVar7;
              local_8f0 = uVar6;
              do {
                uVar11 = (int)uVar8 + iVar14;
                fVar17 = GetPredictionCostCrossColorRed
                                   (puVar13,(int)local_930,tile_width,tile_height,prev_x,prev_y,
                                    uVar11,accumulated_red_histo);
                if (fVar17 < fVar16) {
                  uVar8 = (ulong)uVar11;
                  fVar16 = fVar17;
                }
                iVar14 = iVar14 + uVar7 * 2;
              } while (iVar14 <= (int)local_8e8);
              uVar6 = (ulong)((int)local_8f0 + 1);
            } while ((int)local_8f0 != local_8cc);
            iVar14 = (int)local_930;
          }
          local_8a8 = uVar8;
          fVar16 = GetPredictionCostCrossColorBlue
                             (local_8e0,iVar14,tile_width,tile_height,prev_x,prev_y,0,0,
                              accumulated_blue_histo);
          uVar8 = 0;
          uVar7 = 0;
          do {
            bVar2 = 0x18 < (int)local_8f8;
            local_8e8 = CONCAT44(local_8e8._4_4_,(int)(char)(&DAT_0015bbc0)[uVar8]);
            uVar6 = 0;
            local_8f0 = uVar8;
            uVar11 = uVar4;
            do {
              uVar4 = (char)(&DAT_0015bb80)[uVar6 * 2] * (int)local_8e8 + uVar11;
              uVar10 = (char)(&DAT_0015bb81)[uVar6 * 2] * (int)local_8e8 + uVar7;
              fVar17 = GetPredictionCostCrossColorBlue
                                 (local_8e0,(int)local_930,tile_width,tile_height,prev_x,prev_y,
                                  uVar4,uVar10,accumulated_blue_histo);
              if (fVar16 <= fVar17) {
                fVar17 = fVar16;
                uVar10 = uVar7;
                uVar4 = uVar11;
              }
              uVar7 = uVar10;
              fVar16 = fVar17;
              bVar15 = uVar6 < 7;
              uVar6 = uVar6 + 1;
              uVar11 = uVar4;
            } while ((uVar8 != 4 || bVar2) && bVar15);
          } while ((((2 < local_8f0 - 4) || (uVar7 != 0 || uVar4 != 0)) && (0x18 < (int)local_8f8))
                  && (uVar8 = local_8f0 + 1, uVar8 < local_848));
          uVar11 = (uint)(byte)local_8a8 | (uVar4 & 0xff) << 8 | uVar7 << 0x10;
          iVar14 = (int)local_930 - (int)local_938;
          if ((int)local_900 < iVar14) {
            iVar14 = (int)local_900;
          }
          local_8b0[local_858] = uVar11 | 0xff000000;
          local_93c.red_to_blue_ = (uint8_t)uVar7;
          local_93c._0_2_ = SUB42(uVar11,0);
          if (0 < (int)local_870) {
            puVar13 = local_908 + ((int)local_8c0 + (int)local_938);
            iVar12 = local_8d4;
            do {
              (*VP8LTransformColor)(&local_93c,puVar13,iVar14);
              iVar12 = iVar12 + -1;
              puVar13 = (uint32_t *)((long)puVar13 + local_840);
            } while (1 < iVar12);
          }
          if ((int)local_8b8 < (int)local_8d0) {
            iVar14 = (int)local_8c0 + (int)local_938;
            uVar8 = local_8b8;
            do {
              iVar12 = (int)uVar8 * (int)local_930;
              if ((int)local_938 + iVar12 < iVar12 + local_914) {
                lVar9 = (long)iVar14;
                iVar12 = tile_width;
                do {
                  uVar11 = local_908[lVar9];
                  if ((((lVar9 < 2) || (uVar11 != local_908[lVar9 + -2])) ||
                      (uVar11 != local_908[lVar9 + -1])) &&
                     (((lVar9 < local_880 || (local_908[lVar9 + -2] != local_890[lVar9 + -2])) ||
                      ((local_908[lVar9 + -1] != local_890[lVar9 + -1] ||
                       (uVar11 != local_890[lVar9])))))) {
                    piVar1 = (int *)((long)accumulated_red_histo + (ulong)(uVar11 >> 0xe & 0x3fc));
                    *piVar1 = *piVar1 + 1;
                    accumulated_blue_histo[uVar11 & 0xff] =
                         accumulated_blue_histo[uVar11 & 0xff] + 1;
                  }
                  lVar9 = lVar9 + 1;
                  iVar12 = iVar12 + -1;
                } while (iVar12 != 0);
              }
              uVar11 = (int)uVar8 + 1;
              uVar8 = (ulong)uVar11;
              iVar14 = iVar14 + (int)local_930;
            } while (uVar11 != local_8d0);
          }
          local_850 = local_850 + 1;
          uVar6 = local_8a8;
          uVar8 = local_930;
        } while (local_850 != local_888);
      }
      local_910 = local_910 + 1;
    } while (local_910 != local_898);
  }
  return;
}

Assistant:

void VP8LColorSpaceTransform(int width, int height, int bits, int quality,
                             uint32_t* const argb, uint32_t* image) {
  const int max_tile_size = 1 << bits;
  const int tile_xsize = VP8LSubSampleSize(width, bits);
  const int tile_ysize = VP8LSubSampleSize(height, bits);
  int accumulated_red_histo[256] = { 0 };
  int accumulated_blue_histo[256] = { 0 };
  int tile_x, tile_y;
  VP8LMultipliers prev_x, prev_y;
  MultipliersClear(&prev_y);
  MultipliersClear(&prev_x);
  for (tile_y = 0; tile_y < tile_ysize; ++tile_y) {
    for (tile_x = 0; tile_x < tile_xsize; ++tile_x) {
      int y;
      const int tile_x_offset = tile_x * max_tile_size;
      const int tile_y_offset = tile_y * max_tile_size;
      const int all_x_max = GetMin(tile_x_offset + max_tile_size, width);
      const int all_y_max = GetMin(tile_y_offset + max_tile_size, height);
      const int offset = tile_y * tile_xsize + tile_x;
      if (tile_y != 0) {
        ColorCodeToMultipliers(image[offset - tile_xsize], &prev_y);
      }
      prev_x = GetBestColorTransformForTile(tile_x, tile_y, bits,
                                            prev_x, prev_y,
                                            quality, width, height,
                                            accumulated_red_histo,
                                            accumulated_blue_histo,
                                            argb);
      image[offset] = MultipliersToColorCode(&prev_x);
      CopyTileWithColorTransform(width, height, tile_x_offset, tile_y_offset,
                                 max_tile_size, prev_x, argb);

      // Gather accumulated histogram data.
      for (y = tile_y_offset; y < all_y_max; ++y) {
        int ix = y * width + tile_x_offset;
        const int ix_end = ix + all_x_max - tile_x_offset;
        for (; ix < ix_end; ++ix) {
          const uint32_t pix = argb[ix];
          if (ix >= 2 &&
              pix == argb[ix - 2] &&
              pix == argb[ix - 1]) {
            continue;  // repeated pixels are handled by backward references
          }
          if (ix >= width + 2 &&
              argb[ix - 2] == argb[ix - width - 2] &&
              argb[ix - 1] == argb[ix - width - 1] &&
              pix == argb[ix - width]) {
            continue;  // repeated pixels are handled by backward references
          }
          ++accumulated_red_histo[(pix >> 16) & 0xff];
          ++accumulated_blue_histo[(pix >> 0) & 0xff];
        }
      }
    }
  }
}